

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Pos_index __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
::death(Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
        *this,ID_index pivot)

{
  pointer puVar1;
  pointer pPVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(this->pivotToPosition_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[pivot];
  puVar1 = (this->
           super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
           ).indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->
                            super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                            ).indexToBar_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    uVar4 = (ulong)puVar1[uVar3];
    pPVar2 = (this->
             super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
             ).barcode_.
             super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                   ).barcode_.
                   super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 2) *
            -0x5555555555555555;
    if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
      return *(uint *)((long)(pPVar2 + uVar4) + 8);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Pos_index death(ID_index pivot) const {
    Pos_index simplexIndex = _get_pivot_position(pivot);

    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      return CP::indexToBar_.at(simplexIndex)->death;
    } else {
      return CP::barcode_.at(CP::indexToBar_.at(simplexIndex)).death;
    }
  }